

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_message.hpp
# Opt level: O0

void __thiscall Catch::MessageBuilder::~MessageBuilder(MessageBuilder *this)

{
  MessageBuilder *this_local;
  
  MessageInfo::~MessageInfo(&this->m_info);
  MessageStream::~MessageStream(&this->super_MessageStream);
  return;
}

Assistant:

MessageBuilder( StringRef macroName,
                        SourceLineInfo const& lineInfo,
                        ResultWas::OfType type ):
            m_info(macroName, lineInfo, type) {}